

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSwitch.c
# Opt level: O0

float Gia_ManComputeSwitching(Gia_Man_t *p,int nFrames,int nPref,int fProbOne)

{
  float fVar1;
  int iVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  int *piVar4;
  bool bVar5;
  int local_48;
  int iFan;
  int k;
  int i;
  Gia_Obj_t *pObj;
  float SwiTotal;
  float *pSwi;
  Vec_Int_t *vSwitching;
  int fProbOne_local;
  int nPref_local;
  int nFrames_local;
  Gia_Man_t *p_local;
  
  p_00 = Gia_ManComputeSwitchProbs(p,nFrames,nPref,fProbOne);
  piVar3 = Vec_IntArray(p_00);
  pObj._4_4_ = 0.0;
  iVar2 = Gia_ManHasMapping(p);
  if (iVar2 == 0) {
    iFan = 0;
    while( true ) {
      bVar5 = false;
      if (iFan < p->nObjs) {
        _k = Gia_ManObj(p,iFan);
        bVar5 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar5) break;
      iVar2 = Gia_ObjIsAnd(_k);
      if (iVar2 != 0) {
        iVar2 = Gia_ObjFaninId0(_k,iFan);
        fVar1 = (float)piVar3[iVar2];
        iVar2 = Gia_ObjFaninId1(_k,iFan);
        pObj._4_4_ = fVar1 + (float)piVar3[iVar2] + pObj._4_4_;
      }
      iFan = iFan + 1;
    }
  }
  else {
    for (iFan = 1; iVar2 = Gia_ManObjNum(p), iFan < iVar2; iFan = iFan + 1) {
      iVar2 = Gia_ObjIsLut(p,iFan);
      if (iVar2 != 0) {
        for (local_48 = 0; iVar2 = Gia_ObjLutSize(p,iFan), local_48 < iVar2; local_48 = local_48 + 1
            ) {
          piVar4 = Gia_ObjLutFanins(p,iFan);
          pObj._4_4_ = (float)piVar3[piVar4[local_48]] + pObj._4_4_;
        }
      }
    }
  }
  Vec_IntFree(p_00);
  return pObj._4_4_;
}

Assistant:

float Gia_ManComputeSwitching( Gia_Man_t * p, int nFrames, int nPref, int fProbOne )
{
    Vec_Int_t * vSwitching = Gia_ManComputeSwitchProbs( p, nFrames, nPref, fProbOne );
    float * pSwi = (float *)Vec_IntArray(vSwitching), SwiTotal = 0;
    Gia_Obj_t * pObj;
    int i, k, iFan;
    if ( Gia_ManHasMapping(p) )
    {
        Gia_ManForEachLut( p, i )
            Gia_LutForEachFanin( p, i, iFan, k )
                SwiTotal += pSwi[iFan];
    }
    else
    {
        Gia_ManForEachAnd( p, pObj, i )
            SwiTotal += pSwi[Gia_ObjFaninId0(pObj, i)] + pSwi[Gia_ObjFaninId1(pObj, i)];
    }
    Vec_IntFree( vSwitching );
    return SwiTotal;
}